

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreplyhttpimpl_p.cpp
# Opt level: O1

void QNetworkReplyHttpImpl::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  char *pcVar2;
  long *plVar3;
  DataPointer d;
  char cVar4;
  offset_in_QNetworkReplyHttpImpl_to_subr *candidate;
  undefined8 *puVar5;
  undefined4 uVar6;
  void **ppvVar7;
  InterfaceType *pIVar8;
  int iVar9;
  qint64 maxSize;
  QNetworkReplyHttpImplPrivate *pQVar10;
  long in_FS_OFFSET;
  QArrayData *pQVar11;
  undefined8 local_50;
  void *local_48;
  undefined8 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 0xc:
    case 0x11:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
LAB_0021dfcf:
        *puVar5 = pIVar8;
        goto LAB_0021e071;
      }
      break;
    default:
      puVar5 = (undefined8 *)*_a;
      break;
    case 0x10:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QHttpNetworkRequest>::metaType;
        goto LAB_0021dfcf;
      }
      break;
    case 0x13:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
        goto LAB_0021dfcf;
      }
      break;
    case 0x14:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslConfiguration>::metaType;
        goto LAB_0021dfcf;
      }
      break;
    case 0x15:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_0021dfcf;
      }
      break;
    case 0x16:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkProxy>::metaType;
        goto LAB_0021dfcf;
      }
    }
    *puVar5 = 0;
    goto LAB_0021e071;
  }
  if (_c == IndexOfMethod) {
    plVar3 = (long *)_a[1];
    if (((((code *)*plVar3 == startHttpRequest) && (uVar6 = 0, plVar3[1] == 0)) ||
        (((code *)*plVar3 == abortHttpRequest && (uVar6 = 1, plVar3[1] == 0)))) ||
       (((((code *)*plVar3 == readBufferSizeChanged && (uVar6 = 2, plVar3[1] == 0)) ||
         (((code *)*plVar3 == readBufferFreed && (uVar6 = 3, plVar3[1] == 0)))) ||
        ((((code *)*plVar3 == startHttpRequestSynchronously && (uVar6 = 4, plVar3[1] == 0)) ||
         (((code *)*plVar3 == haveUploadData && (uVar6 = 5, plVar3[1] == 0)))))))) {
      *(undefined4 *)*_a = uVar6;
    }
    goto LAB_0021e071;
  }
  if (_c != InvokeMetaMethod) goto LAB_0021e071;
  switch(_id) {
  case 0:
    iVar9 = 0;
    goto LAB_0021dd95;
  case 1:
    iVar9 = 1;
    goto LAB_0021dd95;
  case 2:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    ppvVar7 = &local_48;
    local_48 = (void *)0x0;
    iVar9 = 2;
    goto LAB_0021dd97;
  case 3:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    ppvVar7 = &local_48;
    local_48 = (void *)0x0;
    iVar9 = 3;
    goto LAB_0021dd97;
  case 4:
    iVar9 = 4;
LAB_0021dd95:
    ppvVar7 = (void **)0x0;
LAB_0021dd97:
    QMetaObject::activate(_o,&staticMetaObject,iVar9,ppvVar7);
    break;
  case 5:
    haveUploadData((QNetworkReplyHttpImpl *)_o,*_a[1],(QByteArray *)_a[2],*_a[3],*_a[4]);
    break;
  case 6:
    QNetworkReplyHttpImplPrivate::_q_startOperation(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
    break;
  case 7:
    QNetworkReplyHttpImplPrivate::_q_cacheLoadReadyRead(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
    break;
  case 8:
    QNetworkReplyHttpImplPrivate::_q_bufferOutgoingData(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
    break;
  case 9:
    QNetworkReplyHttpImplPrivate::_q_bufferOutgoingDataFinished
              (*(QNetworkReplyHttpImplPrivate **)(_o + 8));
    break;
  case 10:
    (**(code **)(**(long **)(*(long *)(_o + 8) + 8) + 0xf0))();
    break;
  case 0xb:
    pQVar10 = *(QNetworkReplyHttpImplPrivate **)(_o + 8);
    goto LAB_0021dd2f;
  case 0xc:
  case 0x11:
    QNetworkReplyHttpImplPrivate::error
              (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1],(QString *)_a[2]);
    break;
  case 0xd:
    pQVar10 = *(QNetworkReplyHttpImplPrivate **)(_o + 8);
    pQVar11 = &((DataPointer *)_a[1])->d->super_QArrayData;
    d = *(DataPointer *)_a[1];
    if (pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&pQVar11->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar11->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QNetworkReplyHttpImplPrivate::replyDownloadData(pQVar10,(QByteArray)d);
    if (pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar11,1,0x10);
      }
    }
    break;
  case 0xe:
    pQVar10 = *(QNetworkReplyHttpImplPrivate **)(_o + 8);
    if (pQVar10->loadingFromCache != false) break;
LAB_0021dd2f:
    QNetworkReplyHttpImplPrivate::finished(pQVar10);
    break;
  case 0xf:
    QNetworkReplyHttpImplPrivate::replyDownloadProgressSlot
              (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1],*_a[2]);
    break;
  case 0x10:
    QNetworkReplyHttpImplPrivate::httpAuthenticationRequired
              (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QHttpNetworkRequest *)_a[1],*_a[2]);
    break;
  case 0x12:
    QNetworkReply::encrypted(*(QNetworkReply **)(*(long *)(_o + 8) + 8));
    break;
  case 0x13:
    QNetworkReplyHttpImplPrivate::replySslErrors
              (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QList<QSslError> *)_a[1],*_a[2],*_a[3]);
    break;
  case 0x14:
    QNetworkReplyHttpImplPrivate::replySslConfigurationChanged
              (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QSslConfiguration *)_a[1]);
    break;
  case 0x15:
    QNetworkReply::preSharedKeyAuthenticationRequired
              (*(QNetworkReply **)(*(long *)(_o + 8) + 8),*_a[1]);
    break;
  case 0x16:
    QNetworkReplyHttpImplPrivate::proxyAuthenticationRequired
              (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QNetworkProxy *)_a[1],*_a[2]);
    break;
  case 0x17:
    lVar1 = *(long *)(_o + 8);
    pcVar2 = *_a[1];
    cVar4 = (**(code **)(**(long **)(lVar1 + 0x278) + 0x80))();
    *pcVar2 = cVar4;
    if (cVar4 != '\0') {
      *(undefined8 *)(lVar1 + 0x288) = 0;
    }
    break;
  case 0x18:
    pQVar10 = *(QNetworkReplyHttpImplPrivate **)(_o + 8);
    maxSize = *_a[1];
    goto LAB_0021df13;
  case 0x19:
    QNetworkReplyHttpImplPrivate::sentUploadDataSlot
              (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1],*_a[2]);
    break;
  case 0x1a:
    pQVar10 = *(QNetworkReplyHttpImplPrivate **)(_o + 8);
    if (pQVar10->uploadDeviceChoking != true) break;
    pQVar10->uploadDeviceChoking = false;
    maxSize = 0x400;
LAB_0021df13:
    QNetworkReplyHttpImplPrivate::wantUploadDataSlot(pQVar10,maxSize);
    break;
  case 0x1b:
    QNetworkReplyHttpImplPrivate::emitReplyUploadProgress
              (*(QNetworkReplyHttpImplPrivate **)(_o + 8),*_a[1],*_a[2]);
    break;
  case 0x1c:
    *(undefined8 *)(*(long *)(_o + 8) + 0x2c8) = 0;
    break;
  case 0x1d:
    QNetworkReplyHttpImplPrivate::_q_metaDataChanged(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
    break;
  case 0x1e:
    QNetworkReplyHttpImplPrivate::onRedirected
              (*(QNetworkReplyHttpImplPrivate **)(_o + 8),(QUrl *)_a[1],*_a[2],*_a[3]);
    break;
  case 0x1f:
    QNetworkReplyHttpImplPrivate::followRedirect(*(QNetworkReplyHttpImplPrivate **)(_o + 8));
  }
LAB_0021e071:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImpl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkReplyHttpImpl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->startHttpRequest(); break;
        case 1: _t->abortHttpRequest(); break;
        case 2: _t->readBufferSizeChanged((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 3: _t->readBufferFreed((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 4: _t->startHttpRequestSynchronously(); break;
        case 5: _t->haveUploadData((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[4]))); break;
        case 6: _t->d_func()->_q_startOperation(); break;
        case 7: _t->d_func()->_q_cacheLoadReadyRead(); break;
        case 8: _t->d_func()->_q_bufferOutgoingData(); break;
        case 9: _t->d_func()->_q_bufferOutgoingDataFinished(); break;
        case 10: _t->d_func()->_q_transferTimedOut(); break;
        case 11: _t->d_func()->_q_finished(); break;
        case 12: _t->d_func()->_q_error((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 13: _t->d_func()->replyDownloadData((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1]))); break;
        case 14: _t->d_func()->replyFinished(); break;
        case 15: _t->d_func()->replyDownloadProgressSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 16: _t->d_func()->httpAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 17: _t->d_func()->httpError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 18: _t->d_func()->replyEncrypted(); break;
        case 19: _t->d_func()->replySslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool*>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>*>>(_a[3]))); break;
        case 20: _t->d_func()->replySslConfigurationChanged((*reinterpret_cast< std::add_pointer_t<QSslConfiguration>>(_a[1]))); break;
        case 21: _t->d_func()->replyPreSharedKeyAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 22: _t->d_func()->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 23: _t->d_func()->resetUploadDataSlot((*reinterpret_cast< std::add_pointer_t<bool*>>(_a[1]))); break;
        case 24: _t->d_func()->wantUploadDataSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 25: _t->d_func()->sentUploadDataSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 26: _t->d_func()->uploadByteDeviceReadyReadSlot(); break;
        case 27: _t->d_func()->emitReplyUploadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 28: _t->d_func()->_q_cacheSaveDeviceAboutToClose(); break;
        case 29: _t->d_func()->_q_metaDataChanged(); break;
        case 30: _t->d_func()->onRedirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 31: _t->d_func()->followRedirect(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 12:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 16:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 17:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 19:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 20:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslConfiguration >(); break;
            }
            break;
        case 21:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 22:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)()>(_a, &QNetworkReplyHttpImpl::startHttpRequest, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)()>(_a, &QNetworkReplyHttpImpl::abortHttpRequest, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)(qint64 )>(_a, &QNetworkReplyHttpImpl::readBufferSizeChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)(qint64 )>(_a, &QNetworkReplyHttpImpl::readBufferFreed, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)()>(_a, &QNetworkReplyHttpImpl::startHttpRequestSynchronously, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReplyHttpImpl::*)(const qint64 , const QByteArray & , bool , qint64 )>(_a, &QNetworkReplyHttpImpl::haveUploadData, 5))
            return;
    }
}